

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsystem.c
# Opt level: O0

unsigned_long
ft_ansi_stream_io(FT_Stream stream,unsigned_long offset,uchar *buffer,unsigned_long count)

{
  FILE *__stream;
  FILE *file;
  unsigned_long count_local;
  uchar *buffer_local;
  unsigned_long offset_local;
  FT_Stream stream_local;
  
  if ((count == 0) && (stream->size < offset)) {
    stream_local = (FT_Stream)0x1;
  }
  else {
    __stream = (FILE *)(stream->descriptor).pointer;
    if (stream->pos != offset) {
      fseek(__stream,offset,0);
    }
    stream_local = (FT_Stream)fread(buffer,1,count,__stream);
  }
  return (unsigned_long)stream_local;
}

Assistant:

FT_CALLBACK_DEF( unsigned long )
  ft_ansi_stream_io( FT_Stream       stream,
                     unsigned long   offset,
                     unsigned char*  buffer,
                     unsigned long   count )
  {
    FT_FILE*  file;


    if ( !count && offset > stream->size )
      return 1;

    file = STREAM_FILE( stream );

    if ( stream->pos != offset )
      ft_fseek( file, (long)offset, SEEK_SET );

    return (unsigned long)ft_fread( buffer, 1, count, file );
  }